

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_PROJECT_LOS_AWARE(effect_handler_context_t *context)

{
  wchar_t typ_00;
  loc_conflict grid_00;
  _Bool _Var1;
  wchar_t dam_00;
  wchar_t wVar2;
  monster_conflict *pmVar3;
  source sVar4;
  source origin;
  loc_conflict grid;
  monster *mon;
  wchar_t flg;
  wchar_t typ;
  wchar_t dam;
  wchar_t i;
  effect_handler_context_t *context_local;
  
  dam_00 = effect_calculate_value
                     ((effect_handler_context_t_conflict *)context,context->other != L'\0');
  typ_00 = context->subtype;
  mon._0_4_ = L'Á';
  if ((context->aware & 1U) != 0) {
    mon._0_4_ = L'ǁ';
  }
  for (typ = L'\x01'; wVar2 = cave_monster_max(cave), typ < wVar2; typ = typ + L'\x01') {
    pmVar3 = cave_monster(cave,typ);
    if ((pmVar3->race != (monster_race *)0x0) && (pmVar3->midx != cave->mon_current)) {
      grid_00.x = (pmVar3->grid).x;
      grid_00.y = (pmVar3->grid).y;
      _Var1 = square_isview((chunk *)cave,grid_00);
      if (_Var1) {
        sVar4 = source_player();
        origin._4_4_ = 0;
        origin.what = sVar4.what;
        origin.which.trap = sVar4.which.trap;
        project(origin,L'\0',grid_00,dam_00,typ_00,(wchar_t)mon,L'\0','\0',context->obj);
        context->ident = true;
      }
    }
  }
  return true;
}

Assistant:

bool effect_handler_PROJECT_LOS_AWARE(effect_handler_context_t *context)
{
	int i;
	int dam = effect_calculate_value(context, context->other ? true : false);
	int typ = context->subtype;

	int flg = PROJECT_JUMP | PROJECT_KILL | PROJECT_HIDE;

	if (context->aware) flg |= PROJECT_AWARE;

	/* Affect all (nearby) monsters */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);
		struct loc grid;

		/* Paranoia -- Skip dead monsters */
		if (!mon->race) continue;

		/* Don't affect the caster */
		if (mon->midx == cave->mon_current) continue;

		/* Location */
		grid = mon->grid;

		/* Require line of sight */
		if (!square_isview(cave, grid)) continue;

		/* Jump directly to the target monster */
		(void)project(source_player(), 0, grid, dam, typ, flg, 0, 0, context->obj);
		context->ident = true;
	}

	/* Result */
	return true;
}